

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::RePost(cmCursesMainForm *this)

{
  FORM *form;
  cmState *pcVar1;
  bool bVar2;
  size_t sVar3;
  FIELD **ppFVar4;
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  pointer ppcVar9;
  ulong uVar10;
  ulong uVar11;
  allocator local_7a;
  allocator local_79;
  ulong local_78;
  string local_70;
  string local_50;
  
  form = (this->super_cmCursesForm).Form;
  if (form != (FORM *)0x0) {
    unpost_form(form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  if (this->Fields != (FIELD **)0x0) {
    operator_delete__(this->Fields);
  }
  if (this->AdvancedMode == true) {
    sVar3 = (long)(this->Entries->
                  super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->Entries->
                  super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3;
    this->NumberOfVisibleEntries = sVar3;
  }
  else {
    this->NumberOfVisibleEntries = 0;
    pvVar5 = this->Entries;
    for (ppcVar9 = (pvVar5->
                   super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppcVar9 !=
        (pvVar5->
        super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
        )._M_impl.super__Vector_impl_data._M_finish; ppcVar9 = ppcVar9 + 1) {
      pcVar1 = this->CMakeInstance->State;
      pcVar6 = cmCursesCacheEntryComposite::GetValue(*ppcVar9);
      std::__cxx11::string::string((string *)&local_70,pcVar6,(allocator *)&local_50);
      pcVar6 = cmState::GetCacheEntryValue(pcVar1,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      pcVar1 = this->CMakeInstance->State;
      pcVar7 = cmCursesCacheEntryComposite::GetValue(*ppcVar9);
      std::__cxx11::string::string((string *)&local_70,pcVar7,&local_79);
      std::__cxx11::string::string((string *)&local_50,"ADVANCED",&local_7a);
      bVar2 = cmState::GetCacheEntryPropertyAsBool(pcVar1,&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if ((pcVar6 != (char *)0x0) && ((!bVar2 || (this->AdvancedMode != false)))) {
        this->NumberOfVisibleEntries = this->NumberOfVisibleEntries + 1;
      }
      pvVar5 = this->Entries;
    }
    sVar3 = this->NumberOfVisibleEntries;
  }
  if (sVar3 == 0) {
    this->NumberOfVisibleEntries = 1;
    uVar10 = 0x20;
    uVar11 = 4;
  }
  else {
    uVar11 = sVar3 * 3 + 1;
    uVar10 = -(ulong)(uVar11 >> 0x3d != 0) | sVar3 * 0x18 + 8;
  }
  ppFVar4 = (FIELD **)operator_new__(uVar10);
  this->Fields = ppFVar4;
  for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
    this->Fields[uVar10] = (FIELD *)0x0;
  }
  pvVar5 = this->Entries;
  ppcVar9 = (pvVar5->
            super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_78 = 0;
  for (; ppcVar9 !=
         (pvVar5->
         super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
         )._M_impl.super__Vector_impl_data._M_finish; ppcVar9 = ppcVar9 + 1) {
    pcVar1 = this->CMakeInstance->State;
    pcVar6 = cmCursesCacheEntryComposite::GetValue(*ppcVar9);
    std::__cxx11::string::string((string *)&local_70,pcVar6,(allocator *)&local_50);
    pcVar6 = cmState::GetCacheEntryValue(pcVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pcVar1 = this->CMakeInstance->State;
    pcVar7 = cmCursesCacheEntryComposite::GetValue(*ppcVar9);
    std::__cxx11::string::string((string *)&local_70,pcVar7,&local_79);
    std::__cxx11::string::string((string *)&local_50,"ADVANCED",&local_7a);
    bVar2 = cmState::GetCacheEntryPropertyAsBool(pcVar1,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if ((pcVar6 != (char *)0x0) && ((!bVar2 || (this->AdvancedMode != false)))) {
      lVar8 = (long)((int)local_78 * 3);
      this->Fields[lVar8] = ((*ppcVar9)->Label->super_cmCursesWidget).Field;
      this->Fields[lVar8 + 1] = ((*ppcVar9)->IsNewLabel->super_cmCursesWidget).Field;
      this->Fields[lVar8 + 2] = (*ppcVar9)->Entry->Field;
      local_78 = (ulong)((int)local_78 + 1);
    }
    pvVar5 = this->Entries;
  }
  ppFVar4 = this->Fields;
  if ((int)local_78 == 0) {
    ppcVar9 = (pvVar5->
              super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    *ppFVar4 = ((*ppcVar9)->Label->super_cmCursesWidget).Field;
    this->Fields[1] = ((*ppcVar9)->IsNewLabel->super_cmCursesWidget).Field;
    this->Fields[2] = (*ppcVar9)->Entry->Field;
    this->NumberOfVisibleEntries = 1;
    ppFVar4 = this->Fields;
    lVar8 = 0x18;
  }
  else {
    lVar8 = this->NumberOfVisibleEntries * 0x18;
  }
  *(undefined8 *)((long)ppFVar4 + lVar8) = 0;
  return;
}

Assistant:

void cmCursesMainForm::RePost()
{
  // Create the fields to be passed to the form.
  if (this->Form)
    {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = 0;
    }
  delete[] this->Fields;
  if (this->AdvancedMode)
    {
    this->NumberOfVisibleEntries = this->Entries->size();
    }
  else
    {
    // If normal mode, count only non-advanced entries
    this->NumberOfVisibleEntries = 0;
    std::vector<cmCursesCacheEntryComposite*>::iterator it;
    for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
      {
      const char* existingValue =
          this->CMakeInstance->GetState()
              ->GetCacheEntryValue((*it)->GetValue());
      bool advanced =
          this->CMakeInstance->GetState()
              ->GetCacheEntryPropertyAsBool((*it)->GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced))
        {
        continue;
        }
      this->NumberOfVisibleEntries++;
      }
    }
  // there is always one even if it is the dummy one
  if(this->NumberOfVisibleEntries == 0)
    {
    this->NumberOfVisibleEntries = 1;
    }
  // Assign the fields: 3 for each entry: label, new entry marker
  // ('*' or ' ') and entry widget
  this->Fields = new FIELD*[3*this->NumberOfVisibleEntries+1];
  size_t cc;
  for ( cc = 0; cc < 3 * this->NumberOfVisibleEntries+1; cc ++ )
    {
    this->Fields[cc] = 0;
    }

  // Assign fields
  int j=0;
  std::vector<cmCursesCacheEntryComposite*>::iterator it;
  for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
    {
    const char* existingValue =
        this->CMakeInstance->GetState()
            ->GetCacheEntryValue((*it)->GetValue());
    bool advanced =
        this->CMakeInstance->GetState()
            ->GetCacheEntryPropertyAsBool((*it)->GetValue(), "ADVANCED");
    if (!existingValue || (!this->AdvancedMode && advanced))
      {
      continue;
      }
    this->Fields[3*j]    = (*it)->Label->Field;
    this->Fields[3*j+1]  = (*it)->IsNewLabel->Field;
    this->Fields[3*j+2]  = (*it)->Entry->Field;
    j++;
    }
  // if no cache entries there should still be one dummy field
  if(j == 0)
    {
    it = this->Entries->begin();
    this->Fields[0]    = (*it)->Label->Field;
    this->Fields[1]  = (*it)->IsNewLabel->Field;
    this->Fields[2]  = (*it)->Entry->Field;
    this->NumberOfVisibleEntries = 1;
    }
  // Has to be null terminated.
  this->Fields[3*this->NumberOfVisibleEntries] = 0;
}